

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O1

void __thiscall
BackwardPass::DeadStoreImplicitCallBailOut
          (BackwardPass *this,Instr *instr,bool hasLiveFields,bool needsLazyBailOut)

{
  code *pcVar1;
  bool bVar2;
  BailOutKind BVar3;
  BailOutKind BVar4;
  undefined4 *puVar5;
  
  if (this->tag != DeadStorePhase) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x960,"(this->tag == Js::DeadStorePhase)","this->tag == Js::DeadStorePhase")
    ;
    if (!bVar2) goto LAB_003e0b35;
    *puVar5 = 0;
  }
  if (((this->currentPrePassLoop == (Loop *)0x0) && ((instr->field_0x38 & 0x10) != 0)) &&
     (bVar2 = OpCodeAttr::BailOutRec(instr->m_opcode), !bVar2)) {
    UpdateArrayBailOutKind(this,instr);
    BVar3 = IR::Instr::GetBailOutKind(instr);
    if (((BVar3 >> 0x1e & 1) != 0) &&
       (BVar3 = IR::Instr::GetBailOutKindNoBits(instr), BVar3 != BailOutOnImplicitCallsPreOp)) {
      BVar3 = IR::Instr::GetBailOutKind(instr);
      BVar4 = IR::Instr::GetBailOutKindNoBits(instr);
      if (BVar4 == BailOutInvalid) {
        if ((BVar3 & ~(LazyBailOut|BailOutForArrayBits)) != BailOutMarkTempObject) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar5 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                             ,0x979,
                             "(BailOutInfo::WithoutLazyBailOut(kind & ~IR::BailOutForArrayBits) == IR::BailOutMarkTempObject)"
                             ,
                             "BailOutInfo::WithoutLazyBailOut(kind & ~IR::BailOutForArrayBits) == IR::BailOutMarkTempObject"
                            );
          if (!bVar2) goto LAB_003e0b35;
          *puVar5 = 0;
        }
        if (((BVar3 >> 0x11 & 1) == 0) &&
           (bVar2 = BasicBlock::IsLandingPad(this->currentBlock), !bVar2)) {
          IR::Instr::SetBailOutKind(instr,BVar3 + BailOutOnImplicitCallsPreOp);
        }
      }
      else if (BVar4 == BailOutOnImplicitCalls) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar5 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                           ,0x975,"(kindNoBits != IR::BailOutOnImplicitCalls)",
                           "kindNoBits != IR::BailOutOnImplicitCalls");
        if (!bVar2) goto LAB_003e0b35;
        *puVar5 = 0;
      }
    }
    BVar3 = IR::Instr::GetBailOutKind(instr);
    if ((BVar3 & ~(BailOutKindBits|BailOutIntOnly)) == BailOutOnImplicitCalls) {
      bVar2 = IsImplicitCallBailOutCurrentlyNeeded(this,instr,true,needsLazyBailOut,hasLiveFields);
      bVar2 = UpdateImplicitCallBailOutKind(instr,bVar2,needsLazyBailOut);
      if (!bVar2) {
        IR::Instr::ClearBailOutInfo(instr);
        if (this->preOpBailOutInstrToProcess == instr) {
          this->preOpBailOutInstrToProcess = (Instr *)0x0;
        }
        if ((this->tag == DeadStorePhase) && (bVar2 = SatisfyMarkTempObjectsConditions(this), bVar2)
           ) {
          ObjectTempVerify::NotifyBailOutRemoval
                    (&this->currentBlock->tempObjectVerifyTracker->super_ObjectTempVerify,instr,this
                    );
          return;
        }
      }
    }
    else {
      BVar3 = IR::Instr::GetBailOutKind(instr);
      if ((BVar3 >> 0x1e & 1) != 0) {
        if (BVar3 != BailOutMarkTempObject) {
          IR::Instr::SetBailOutKind(instr,BVar3 & ~BailOutMarkTempObject);
          return;
        }
        bVar2 = BasicBlock::IsLandingPad(this->currentBlock);
        if (!bVar2) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar5 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                             ,0x98f,"(this->currentBlock->IsLandingPad())",
                             "this->currentBlock->IsLandingPad()");
          if (!bVar2) {
LAB_003e0b35:
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *puVar5 = 0;
        }
        IR::Instr::ClearBailOutInfo(instr);
        if (this->preOpBailOutInstrToProcess == instr) {
          this->preOpBailOutInstrToProcess = (Instr *)0x0;
        }
      }
    }
  }
  return;
}

Assistant:

void
BackwardPass::DeadStoreImplicitCallBailOut(IR::Instr * instr, bool hasLiveFields, bool needsLazyBailOut)
{
    Assert(this->tag == Js::DeadStorePhase);

    if (this->IsPrePass() || !instr->HasBailOutInfo())
    {
        // Don't do this in the pre-pass, because, for instance, we don't have live-on-back-edge fields yet.
        return;
    }

    if (OpCodeAttr::BailOutRec(instr->m_opcode))
    {
        // This is something like OpCode::BailOutOnNotEqual. Assume it needs what it's got.
        return;
    }

    UpdateArrayBailOutKind(instr);

    // Install the implicit call PreOp for mark temp object if we need one.
    if ((instr->GetBailOutKind() & IR::BailOutMarkTempObject) != 0 && instr->GetBailOutKindNoBits() != IR::BailOutOnImplicitCallsPreOp)
    {
        IR::BailOutKind kind = instr->GetBailOutKind();
        const IR::BailOutKind kindNoBits = instr->GetBailOutKindNoBits();
        Assert(kindNoBits != IR::BailOutOnImplicitCalls);
        if (kindNoBits == IR::BailOutInvalid)
        {
            // We should only have combined with array bits or lazy bailout
            Assert(BailOutInfo::WithoutLazyBailOut(kind & ~IR::BailOutForArrayBits) == IR::BailOutMarkTempObject);
            // Don't need to install if we are not going to do helper calls,
            // or we are in the landingPad since implicit calls are already turned off.
            if ((kind & IR::BailOutOnArrayAccessHelperCall) == 0 && !this->currentBlock->IsLandingPad())
            {
                kind += IR::BailOutOnImplicitCallsPreOp;
                instr->SetBailOutKind(kind);
            }
        }
    }

    // Currently only try to eliminate these bailout kinds. The others are required in cases
    // where we don't necessarily have live/hoisted fields.
    const bool mayNeedBailOnImplicitCall = BailOutInfo::IsBailOutOnImplicitCalls(instr->GetBailOutKind());
    if (!mayNeedBailOnImplicitCall)
    {
        const IR::BailOutKind kind = instr->GetBailOutKind();
        if (kind & IR::BailOutMarkTempObject)
        {
            if (kind == IR::BailOutMarkTempObject)
            {
                // Landing pad does not need per-instr implicit call bailouts.
                Assert(this->currentBlock->IsLandingPad());
                instr->ClearBailOutInfo();
                if (this->preOpBailOutInstrToProcess == instr)
                {
                    this->preOpBailOutInstrToProcess = nullptr;
                }
            }
            else
            {
                // Mark temp object bit is not needed after dead store pass
                instr->SetBailOutKind(kind & ~IR::BailOutMarkTempObject);
            }
        }
        return;
    }

    // We have an implicit call bailout in the code, and we want to make sure that it's required.
    // Do this now, because only in the dead store pass do we have complete forward and backward liveness info.
    bool needsBailOutOnImplicitCall = this->IsImplicitCallBailOutCurrentlyNeeded(instr, mayNeedBailOnImplicitCall, needsLazyBailOut, hasLiveFields);
    if(!UpdateImplicitCallBailOutKind(instr, needsBailOutOnImplicitCall, needsLazyBailOut))
    {
        instr->ClearBailOutInfo();
        if (preOpBailOutInstrToProcess == instr)
        {
            preOpBailOutInstrToProcess = nullptr;
        }
#if DBG
        if (this->DoMarkTempObjectVerify())
        {
            this->currentBlock->tempObjectVerifyTracker->NotifyBailOutRemoval(instr, this);
        }
#endif
    }
}